

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O0

SQBool sqstd_rex_match(SQRex *exp,SQChar *text)

{
  size_t sVar1;
  SQChar *pSVar2;
  char *in_RSI;
  long in_RDI;
  SQChar *res;
  SQRexNode *in_stack_000000a0;
  SQChar *in_stack_000000a8;
  SQRexNode *in_stack_000000b0;
  SQRex *in_stack_000000b8;
  SQBool local_8;
  
  *(char **)(in_RDI + 0x10) = in_RSI;
  sVar1 = strlen(in_RSI);
  *(char **)(in_RDI + 8) = in_RSI + sVar1;
  *(undefined8 *)(in_RDI + 0x58) = 0;
  pSVar2 = sqstd_rex_matchnode(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
                               in_stack_000000a0);
  if ((pSVar2 == (SQChar *)0x0) || (pSVar2 != *(SQChar **)(in_RDI + 8))) {
    local_8 = 0;
  }
  else {
    local_8 = 1;
  }
  return local_8;
}

Assistant:

SQBool sqstd_rex_match(SQRex* exp,const SQChar* text)
{
    const SQChar* res = NULL;
    exp->_bol = text;
    exp->_eol = text + strlen(text);
    exp->_currsubexp = 0;
    res = sqstd_rex_matchnode(exp,exp->_nodes,text,NULL);
    if(res == NULL || res != exp->_eol)
        return SQFalse;
    return SQTrue;
}